

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

cmGeneratorTarget * __thiscall
TargetArtifactBase::GetTarget
          (TargetArtifactBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  cmGeneratorTarget *pcVar1;
  GeneratorExpressionContent *pGVar2;
  bool bVar3;
  TargetType TVar4;
  cmGeneratorTarget *pcVar5;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  cmGeneratorTarget *local_a0;
  cmGeneratorTarget *target;
  allocator<char> local_81;
  string local_80;
  string local_60;
  string *local_40;
  string *name;
  cmGeneratorExpressionDAGChecker *dagChecker_local;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  TargetArtifactBase *this_local;
  
  name = (string *)dagChecker;
  dagChecker_local = (cmGeneratorExpressionDAGChecker *)content;
  content_local = (GeneratorExpressionContent *)context;
  context_local = (cmGeneratorExpressionContext *)parameters;
  parameters_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  local_40 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(parameters);
  bVar3 = cmGeneratorExpression::IsValidTargetName(local_40);
  pGVar2 = content_local;
  if (bVar3) {
    local_a0 = cmLocalGenerator::FindGeneratorTargetToUse
                         ((cmLocalGenerator *)
                          content_local[3].ParamChildren.
                          super__Vector_base<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>,_std::allocator<std::vector<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluator,_std::default_delete<cmGeneratorExpressionEvaluator>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,local_40);
    pGVar2 = content_local;
    if (local_a0 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_c0,(GeneratorExpressionContent *)dagChecker_local);
      std::operator+(&local_100,"No target \"",local_40);
      std::operator+(&local_e0,&local_100,"\"");
      reportError((cmGeneratorExpressionContext *)pGVar2,&local_c0,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_c0);
      this_local = (TargetArtifactBase *)0x0;
    }
    else {
      TVar4 = cmGeneratorTarget::GetType(local_a0);
      if (((int)TVar4 < 4) ||
         (TVar4 = cmGeneratorTarget::GetType(local_a0), pGVar2 = content_local,
         TVar4 == UNKNOWN_LIBRARY)) {
        if ((name == (string *)0x0) ||
           ((bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                               ((cmGeneratorExpressionDAGChecker *)name,local_a0,ANY), !bVar3 &&
            ((bVar3 = cmGeneratorExpressionDAGChecker::EvaluatingSources
                                ((cmGeneratorExpressionDAGChecker *)name), pcVar1 = local_a0, !bVar3
             || (pcVar5 = cmGeneratorExpressionDAGChecker::TopTarget
                                    ((cmGeneratorExpressionDAGChecker *)name), pcVar1 != pcVar5)))))
           ) {
          this_local = (TargetArtifactBase *)local_a0;
        }
        else {
          pGVar2 = content_local;
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                    (&local_180,(GeneratorExpressionContent *)dagChecker_local);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1a0,
                     "Expressions which require the linker language may not be used while evaluating link libraries"
                     ,&local_1a1);
          reportError((cmGeneratorExpressionContext *)pGVar2,&local_180,&local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::allocator<char>::~allocator(&local_1a1);
          std::__cxx11::string::~string((string *)&local_180);
          this_local = (TargetArtifactBase *)0x0;
        }
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                  (&local_120,(GeneratorExpressionContent *)dagChecker_local);
        std::operator+(&local_160,"Target \"",local_40);
        std::operator+(&local_140,&local_160,"\" is not an executable or library.");
        reportError((cmGeneratorExpressionContext *)pGVar2,&local_120,&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_120);
        this_local = (TargetArtifactBase *)0x0;
      }
    }
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)dagChecker_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"Expression syntax not recognized.",&local_81);
    reportError((cmGeneratorExpressionContext *)pGVar2,&local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string((string *)&local_60);
    this_local = (TargetArtifactBase *)0x0;
  }
  return (cmGeneratorTarget *)this_local;
}

Assistant:

cmGeneratorTarget* GetTarget(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagChecker) const
  {
    // Lookup the referenced target.
    std::string const& name = parameters.front();

    if (!cmGeneratorExpression::IsValidTargetName(name)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return nullptr;
    }
    cmGeneratorTarget* target = context->LG->FindGeneratorTargetToUse(name);
    if (!target) {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return nullptr;
    }
    if (target->GetType() >= cmStateEnums::OBJECT_LIBRARY &&
        target->GetType() != cmStateEnums::UNKNOWN_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Target \"" + name +
                      "\" is not an executable or library.");
      return nullptr;
    }
    if (dagChecker &&
        (dagChecker->EvaluatingLinkLibraries(target) ||
         (dagChecker->EvaluatingSources() &&
          target == dagChecker->TopTarget()))) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return nullptr;
    }

    return target;
  }